

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

stack<int,_std::deque<int,_std::allocator<int>_>_> * __thiscall
CP::stack<int>::remove_top
          (stack<int,_std::deque<int,_std::allocator<int>_>_> *__return_storage_ptr__,
          stack<int> *this,size_t K)

{
  bool bVar1;
  int *__x;
  reference __x_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> it;
  pointer local_40;
  size_t i;
  vector<int,_std::allocator<int>_> v;
  size_t K_local;
  stack<int> *this_local;
  stack<int,_std::deque<int,_std::allocator<int>_>_> *s;
  
  v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)K;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&i);
  local_40 = (pointer)0x0;
  while ((local_40 <
          v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage && (this->mSize != 0))) {
    __x = top(this);
    std::vector<int,_std::allocator<int>_>::push_back((vector<int,_std::allocator<int>_> *)&i,__x);
    this->mSize = this->mSize - 1;
    local_40 = (pointer)((long)local_40 + 1);
  }
  std::stack<int,std::deque<int,std::allocator<int>>>::
  stack<std::deque<int,std::allocator<int>>,void>
            ((stack<int,std::deque<int,std::allocator<int>>> *)__return_storage_ptr__);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty((vector<int,_std::allocator<int>_> *)&i);
  if (!bVar1) {
    local_68._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)&i)
    ;
    local_60 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(&local_68,1);
    while( true ) {
      local_70._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&i);
      bVar1 = __gnu_cxx::operator>=(&local_60,&local_70);
      if (!bVar1) break;
      __x_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_60);
      std::stack<int,_std::deque<int,_std::allocator<int>_>_>::push(__return_storage_ptr__,__x_00);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
                (&local_60);
    }
  }
  it._M_current._4_4_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::stack<T> CP::stack<T>::remove_top(size_t K) {
  //write your code here
  //
  //don't forget to return an std::stack
  std::vector<T> v;
  for (size_t i = 0; i < K; ++i) {
    if (mSize == 0) break;
    v.push_back(top());
    mSize--;
  }
  std::stack<T> s;
  if (v.empty()) return s;
  for (auto it = v.end() - 1; it >= v.begin(); --it) {
    s.push(*it);
  }
  return s;
}